

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O3

Am_Value control_q_or_none_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Object *in_RSI;
  Am_Value AVar3;
  Am_Widget_Look look;
  Am_Object widget;
  Am_Input_Char local_1c;
  Am_Object local_18;
  
  pAVar2 = Am_Object::Get(in_RSI,0x170,3);
  Am_Object::Am_Object(&local_18,pAVar2);
  bVar1 = Am_Object::Valid(&local_18);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_18,0x17f,4);
    local_1c = (Am_Input_Char)0x0;
    if ((pAVar2->type != 1) && (pAVar2->type != Am_Widget_Look::Am_Widget_Look_ID)) {
      Am_Widget_Look::TypeError((Am_Widget_Look *)&local_1c,pAVar2);
    }
    local_1c = (Am_Input_Char)(pAVar2->value).float_value;
    if ((Am_Input_Char)Am_WINDOWS_LOOK.value == local_1c) {
      Am_Value::Am_Value((Am_Value *)self,&Am_No_Value);
      goto LAB_00240c18;
    }
  }
  Am_Input_Char::Am_Input_Char(&local_1c,"CONTROL_q",true);
  Am_Input_Char::operator_cast_to_Am_Value(&local_1c);
LAB_00240c18:
  Am_Object::~Am_Object(&local_18);
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = self;
  return AVar3;
}

Assistant:

Am_Define_Formula(Am_Value, control_q_or_none)
{
  Am_Object widget = self.Get(Am_SAVED_OLD_OWNER, Am_RETURN_ZERO_ON_ERROR);
  if (widget.Valid()) {
    Am_Widget_Look look = widget.Get(Am_WIDGET_LOOK, Am_NO_DEPENDENCY);
    if (look == Am_WINDOWS_LOOK)
      return Am_No_Value;
  }
  Am_Value v = Am_Input_Char("CONTROL_q");
  return v;
}